

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O0

char * getVertexName(Abc_Ntk_t *pNtk,int v)

{
  int iVar1;
  char *pcVar2;
  Abc_Obj_t *pAStack_20;
  int numouts;
  Abc_Obj_t *pObj;
  int v_local;
  Abc_Ntk_t *pNtk_local;
  
  iVar1 = Abc_NtkPoNum(pNtk);
  if (v < iVar1) {
    pAStack_20 = (Abc_Obj_t *)Vec_PtrEntry(pNtk->vPos,v);
  }
  else {
    pAStack_20 = (Abc_Obj_t *)Vec_PtrEntry(pNtk->vPis,v - iVar1);
  }
  pcVar2 = Abc_ObjName(pAStack_20);
  return pcVar2;
}

Assistant:

static char * 
getVertexName(Abc_Ntk_t *pNtk, int v)
{   
    Abc_Obj_t * pObj;
    int numouts =  Abc_NtkPoNum(pNtk);

    if (v < numouts)    
        pObj = (Abc_Obj_t *)Vec_PtrEntry(pNtk->vPos, v);
    else
        pObj = (Abc_Obj_t *)Vec_PtrEntry(pNtk->vPis, v - numouts);       
    
    return Abc_ObjName(pObj);
}